

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::SampledFunc::SampledFunc(SampledFunc *this)

{
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,Sampled,Function);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_005a3658;
  return;
}

Assistant:

SampledFunc() : SystemSubroutine(KnownSystemName::Sampled, SubroutineKind::Function) {}